

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O3

int sptk::world::anon_unknown_5::ZeroCrossingEngine
              (double *filtered_signal,int y_length,double fs,double *interval_locations,
              double *intervals)

{
  double dVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  undefined4 uVar10;
  bool bVar11;
  double dVar12;
  
  uVar5 = 0xffffffffffffffff;
  if (-1 < y_length) {
    uVar5 = (ulong)(uint)y_length * 4;
  }
  pvVar3 = operator_new__(uVar5);
  if (1 < y_length) {
    uVar7 = 1;
    do {
      uVar10 = 0;
      if ((0.0 < filtered_signal[uVar7 - 1]) && (filtered_signal[uVar7] <= 0.0)) {
        uVar10 = (undefined4)uVar7;
      }
      *(undefined4 *)((long)pvVar3 + uVar7 * 4 + -4) = uVar10;
      bVar11 = uVar7 != y_length - 1U;
      uVar7 = uVar7 + 1;
    } while (bVar11);
  }
  *(undefined4 *)((long)pvVar3 + (long)(int)(y_length - 1U) * 4) = 0;
  pvVar4 = operator_new__(uVar5);
  if (0 < y_length) {
    uVar5 = 0;
    uVar7 = 0;
    do {
      iVar2 = *(int *)((long)pvVar3 + uVar5 * 4);
      if (0 < iVar2) {
        iVar8 = (int)uVar7;
        uVar7 = (ulong)(iVar8 + 1);
        *(int *)((long)pvVar4 + (long)iVar8 * 4) = iVar2;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)y_length != uVar5);
    if (1 < (int)uVar7) {
      pdVar6 = (double *)operator_new__(uVar7 * 8);
      uVar5 = 0;
      do {
        iVar2 = *(int *)((long)pvVar4 + uVar5 * 4);
        pdVar6[uVar5] =
             (double)iVar2 -
             filtered_signal[(long)iVar2 + -1] /
             (filtered_signal[iVar2] - filtered_signal[(long)iVar2 + -1]);
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
      uVar9 = (int)uVar7 - 1;
      uVar5 = 0;
      dVar12 = *pdVar6;
      do {
        dVar1 = pdVar6[uVar5 + 1];
        intervals[uVar5] = fs / (dVar1 - dVar12);
        interval_locations[uVar5] = ((dVar12 + dVar1) * 0.5) / fs;
        uVar5 = uVar5 + 1;
        dVar12 = dVar1;
      } while (uVar9 != uVar5);
      operator_delete__(pdVar6);
      goto LAB_00126016;
    }
  }
  uVar9 = 0;
LAB_00126016:
  operator_delete__(pvVar4);
  operator_delete__(pvVar3);
  return uVar9;
}

Assistant:

static int ZeroCrossingEngine(const double *filtered_signal, int y_length,
    double fs, double *interval_locations, double *intervals) {
  int *negative_going_points = new int[y_length];

  for (int i = 0; i < y_length - 1; ++i)
    negative_going_points[i] =
      0.0 < filtered_signal[i] && filtered_signal[i + 1] <= 0.0 ? i + 1 : 0;
  negative_going_points[y_length - 1] = 0;

  int *edges = new int[y_length];
  int count = 0;
  for (int i = 0; i < y_length; ++i)
    if (negative_going_points[i] > 0)
      edges[count++] = negative_going_points[i];

  if (count < 2) {
    delete[] edges;
    delete[] negative_going_points;
    return 0;
  }

  double *fine_edges = new double[count];
  for (int i = 0; i < count; ++i)
    fine_edges[i] = edges[i] - filtered_signal[edges[i] - 1] /
      (filtered_signal[edges[i]] - filtered_signal[edges[i] - 1]);

  for (int i = 0; i < count - 1; ++i) {
    intervals[i] = fs / (fine_edges[i + 1] - fine_edges[i]);
    interval_locations[i] = (fine_edges[i] + fine_edges[i + 1]) / 2.0 / fs;
  }

  delete[] fine_edges;
  delete[] edges;
  delete[] negative_going_points;
  return count - 1;
}